

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkRef(IntegrityCk *pCheck,Pgno iPage)

{
  byte bVar1;
  char *zFormat;
  
  if (iPage != 0) {
    if (pCheck->nPage < iPage) {
      zFormat = "invalid page number %d";
    }
    else {
      bVar1 = pCheck->aPgRef[iPage >> 3];
      if ((bVar1 >> (iPage & 7) & 1) == 0) {
        pCheck->aPgRef[iPage >> 3] = (byte)(1 << ((byte)iPage & 7)) | bVar1;
        return 0;
      }
      zFormat = "2nd reference to page %d";
    }
    checkAppendMsg(pCheck,zFormat);
  }
  return 1;
}

Assistant:

static int checkRef(IntegrityCk *pCheck, Pgno iPage){
  if( iPage==0 ) return 1;
  if( iPage>pCheck->nPage ){
    checkAppendMsg(pCheck, "invalid page number %d", iPage);
    return 1;
  }
  if( getPageReferenced(pCheck, iPage) ){
    checkAppendMsg(pCheck, "2nd reference to page %d", iPage);
    return 1;
  }
  setPageReferenced(pCheck, iPage);
  return 0;
}